

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  ulong uVar1;
  Desc<google::protobuf::json_internal::UnparseProto3Type> *desc;
  bool bVar2;
  MessageType MVar3;
  double dVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 unaff_RBP;
  Status *_status;
  ulong uVar7;
  char *bytes;
  double idx;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  string_view name;
  string_view sVar11;
  StatusOr<long> x;
  anon_union_8_1_1246618d_for_StatusOrData<double>_1 local_e0;
  float local_d8;
  undefined4 uStack_d4;
  Desc<google::protobuf::json_internal::UnparseProto3Type> *pDStack_d0;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_b0;
  double local_a8;
  double dStack_a0;
  string *local_98;
  JsonWriter *local_90;
  double local_88;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_80;
  Desc<google::protobuf::json_internal::UnparseProto3Type> *pDStack_78;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  local_b0 = msg;
  dVar4 = (double)UntypedMessage::Count(msg,(field->raw_->field_0)._impl_.number_);
  if (dVar4 == 0.0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_98 = &writer->scratch_buf_;
    uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    idx = 0.0;
    local_90 = writer;
    local_88 = dVar4;
    do {
      sVar11 = Proto3Type::FieldTypeName(field);
      name._M_str = sVar11._M_str;
      name._M_len = (size_t)name._M_str;
      MVar3 = ClassifyMessage((json_internal *)sVar11._M_len,name);
      if (MVar3 == kValue) {
        local_a8 = (double)CONCAT44(local_a8._4_4_,(int)uVar7);
        ResolverPool::Field::MessageType((Field *)&local_80.status_);
        desc = pDStack_78;
        *(anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
          *)this = local_80;
        if (((ulong)local_80 & 1) == 0) {
          LOCK();
          *(int *)local_80 = *(int *)local_80 + 1;
          UNLOCK();
        }
        iVar8 = 0;
        if (local_80 ==
            (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
             )0x1) {
          UnparseProto3Type::GetMessage
                    ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
          *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
          if (((ulong)local_e0 & 1) == 0) {
            LOCK();
            *(int *)local_e0 = *(int *)local_e0 + 1;
            UNLOCK();
          }
          iVar8 = 0;
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            bVar2 = IsEmpty<google::protobuf::json_internal::UnparseProto3Type>
                              ((Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                               CONCAT44(uStack_d4,local_d8),desc);
            *(undefined8 *)this = 1;
            iVar8 = (uint)bVar2 << 2;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                     &local_e0.status_);
          writer = local_90;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_80.status_);
        if (*(long *)this != 1) {
          iVar8 = 1;
        }
        dVar4 = local_88;
        if (iVar8 != 4) {
          uVar7 = (ulong)local_a8 & 0xffffffff;
          if (iVar8 != 0) {
            return (Status)(uintptr_t)this;
          }
          goto LAB_002d96b2;
        }
        uVar7 = (ulong)local_a8 & 0xffffffff;
        goto LAB_002d9cdf;
      }
LAB_002d96b2:
      if ((uVar7 & 1) == 0) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      else {
        uVar7 = 0;
      }
      JsonWriter::NewLine(writer);
      iVar8 = (field->raw_->field_0)._impl_.kind_;
      switch(iVar8) {
      case 1:
        UnparseProto3Type::GetDouble
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            JsonWriter::Write(writer,(double)CONCAT44(uStack_d4,local_d8));
            absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                      ((StatusOrData<double> *)&local_e0.status_);
            goto LAB_002d9cd2;
          }
          goto LAB_002d9da9;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                  ((StatusOrData<double> *)&local_e0.status_);
        break;
      case 2:
        UnparseProto3Type::GetFloat
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            JsonWriter::Write(writer,local_d8);
            absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                      ((StatusOrData<float> *)&local_e0.status_);
            goto LAB_002d9cd2;
          }
          goto LAB_002d9dbd;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                  ((StatusOrData<float> *)&local_e0.status_);
        break;
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if ((writer->options_).unquote_int64_if_possible == true) {
            if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1)
            goto LAB_002d9d6d;
            bVar2 = RoundTripsThroughDouble<long>(CONCAT44(uStack_d4,local_d8));
            if (!bVar2) goto LAB_002d9973;
            if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1)
            goto LAB_002d9d6d;
            JsonWriter::Write(writer,CONCAT44(uStack_d4,local_d8));
          }
          else {
LAB_002d9973:
            if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
LAB_002d9d6d:
              absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
              goto LAB_002d9d77;
            }
            local_80.status_.rep_._4_4_ = uStack_d4;
            local_80.status_.rep_._0_4_ = local_d8;
            JsonWriter::Write<long>(writer,(Quoted<long> *)&local_80.status_);
          }
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_e0.status_);
LAB_002d9cd2:
          *(undefined8 *)this = 1;
        }
        else {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_e0.status_);
        }
        break;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if ((writer->options_).unquote_int64_if_possible == true) {
            if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
              uVar1 = CONCAT44(uStack_d4,local_d8);
              auVar10._8_4_ = uStack_d4;
              auVar10._0_8_ = uVar1;
              auVar10._12_4_ = 0x45300000;
              dStack_a0 = auVar10._8_8_ - 1.9342813113834067e+25;
              local_a8 = dStack_a0 + ((double)CONCAT44(0x43300000,local_d8) - 4503599627370496.0);
              dVar9 = ldexp(1.0,0x40);
              writer = local_90;
              if (uVar1 != ((long)(local_a8 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f |
                           (long)local_a8) || dVar9 <= local_a8) goto LAB_002d9ca5;
              if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1)
              goto LAB_002d9d81;
              JsonWriter::Write(local_90,CONCAT44(uStack_d4,local_d8));
              goto LAB_002d9cc8;
            }
          }
          else {
LAB_002d9ca5:
            if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
              local_80.status_.rep_._4_4_ = uStack_d4;
              local_80.status_.rep_._0_4_ = local_d8;
              JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_80.status_);
LAB_002d9cc8:
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                        ((StatusOrData<unsigned_long> *)&local_e0.status_);
              goto LAB_002d9cd2;
            }
          }
LAB_002d9d81:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9d8b:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9d95:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
          goto LAB_002d9d9f;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_e0.status_);
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            JsonWriter::Write(writer,(int32_t)local_d8);
LAB_002d9b71:
            absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                      ((StatusOrData<int> *)&local_e0.status_);
            goto LAB_002d9cd2;
          }
LAB_002d9d77:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
          goto LAB_002d9d81;
        }
LAB_002d9b80:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_e0.status_);
        break;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            JsonWriter::Write(writer,(uint32_t)local_d8);
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                      ((StatusOrData<unsigned_int> *)&local_e0.status_);
            goto LAB_002d9cd2;
          }
          goto LAB_002d9d8b;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_e0.status_);
        break;
      case 8:
        UnparseProto3Type::GetBool
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1)
          goto LAB_002d9dd1;
          bytes = "false";
          if ((ulong)local_d8._0_1_ != 0) {
            bytes = "true";
          }
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,bytes,(ulong)local_d8._0_1_ ^ 5);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                    ((StatusOrData<bool> *)&local_e0.status_);
          goto LAB_002d9cd2;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e0.status_);
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e0.status_,field,local_98,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
            local_80.status_.rep_._4_4_ = uStack_d4;
            local_80.status_.rep_._0_4_ = local_d8;
            pDStack_78 = pDStack_d0;
            JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                      (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &local_80.status_);
LAB_002d9be3:
            absl::lts_20240722::internal_statusor::
            StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                      ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &local_e0.status_);
            goto LAB_002d9cd2;
          }
          goto LAB_002d9db3;
        }
LAB_002d9bf2:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e0.status_);
        break;
      case 10:
      case 0xb:
        UnparseProto3Type::GetMessage
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this == 1) {
          if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1)
          goto LAB_002d9d95;
          WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
                    (this,writer,
                     (Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                     CONCAT44(uStack_d4,local_d8),
                     ((Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                     CONCAT44(uStack_d4,local_d8))->desc_,false);
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_e0.status_);
        break;
      case 0xc:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e0.status_,field,local_98,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this != 1) goto LAB_002d9bf2;
        if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
          sVar11._M_len._4_4_ = uStack_d4;
          sVar11._M_len._0_4_ = local_d8;
          sVar11._M_str = (char *)pDStack_d0;
          JsonWriter::WriteBase64(writer,sVar11);
          goto LAB_002d9be3;
        }
LAB_002d9d9f:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9da9:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9db3:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9dbd:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
        goto LAB_002d9dc7;
      case 0xe:
        UnparseProto3Type::GetEnumValue
                  ((UnparseProto3Type *)&local_e0.status_,field,local_b0,(size_t)idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<double>_1 *)this = local_e0;
        if (((ulong)local_e0 & 1) == 0) {
          LOCK();
          *(int *)local_e0 = *(int *)local_e0 + 1;
          UNLOCK();
        }
        if (*(long *)this != 1) goto LAB_002d9b80;
        if (local_e0 == (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x1) {
          WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                    (writer,field,(int32_t)local_d8,kUnquoted);
          goto LAB_002d9b71;
        }
LAB_002d9dc7:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
LAB_002d9dd1:
        uVar6 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0.status_);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                  ((StatusOrData<double> *)&local_e0.status_);
        _Unwind_Resume(uVar6);
      default:
        uVar7 = uVar7 & 0xffffffff;
        local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<double>_1)0x18;
        local_d8 = 5.757603e-39;
        uStack_d4 = 0;
        local_a8 = idx;
        lVar5 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                          (iVar8,(char *)&stack0xffffffffffffff90);
        local_80 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                    )(lVar5 - (long)&stack0xffffffffffffff90);
        pDStack_78 = (Desc<google::protobuf::json_internal::UnparseProto3Type> *)
                     &stack0xffffffffffffff90;
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&stack0xffffffffffffffb0,(AlphaNum *)&local_e0.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_48,local_50);
        idx = local_a8;
        if ((undefined8 *)local_50 != &stack0xffffffffffffffc0) {
          operator_delete((void *)local_50,
                          (ulong)((long)&(((Arena *)local_40)->impl_).tag_and_id_ + 1));
          idx = local_a8;
        }
      }
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
LAB_002d9cdf:
      idx = (double)((long)idx + 1);
    } while (dVar4 != idx);
    writer->indent_ = writer->indent_ + -1;
    if ((uVar7 & 1) == 0) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}